

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimCreator.cpp
# Opt level: O3

void __thiscall OpenMD::SimCreator::gatherParameters(SimCreator *this,SimInfo *info,string *mdfile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Globals *pGVar2;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string prefix;
  string local_80;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  string local_40;
  
  local_58 = 0;
  local_50 = 0;
  pGVar2 = info->simParams_;
  local_60 = &local_50;
  if ((pGVar2->FinalConfig).super_ParameterBase.empty_ == false) {
    pcVar3 = (pGVar2->FinalConfig).data_._M_dataplus._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar3,pcVar3 + (pGVar2->FinalConfig).data_._M_string_length);
    getPrefix(&local_80,&local_40);
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    local_80._M_dataplus._M_p = local_40._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) goto LAB_00167e90;
  }
  else {
    getPrefix(&local_80,mdfile);
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
    local_40.field_2._M_allocated_capacity = local_80.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_00167e90;
  }
  operator_delete(local_80._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
LAB_00167e90:
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_60,local_60 + local_58);
  std::__cxx11::string::append((char *)&local_80);
  std::__cxx11::string::_M_assign((string *)&info->finalConfigFileName_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_60,local_60 + local_58);
  std::__cxx11::string::append((char *)&local_80);
  std::__cxx11::string::_M_assign((string *)&info->dumpFileName_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_60,local_60 + local_58);
  std::__cxx11::string::append((char *)&local_80);
  std::__cxx11::string::_M_assign((string *)&info->statFileName_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_60,local_60 + local_58);
  std::__cxx11::string::append((char *)&local_80);
  std::__cxx11::string::_M_assign((string *)&info->reportFileName_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_60,local_60 + local_58);
  std::__cxx11::string::append((char *)&local_80);
  std::__cxx11::string::_M_assign((string *)&info->restFileName_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return;
}

Assistant:

void SimCreator::gatherParameters(SimInfo* info, const std::string& mdfile) {
    // figure out the output file names
    std::string prefix;

#ifdef IS_MPI

    if (worldRank == 0) {
#endif  // is_mpi
      Globals* simParams = info->getSimParams();
      if (simParams->haveFinalConfig()) {
        prefix = getPrefix(simParams->getFinalConfig());
      } else {
        prefix = getPrefix(mdfile);
      }

      info->setFinalConfigFileName(prefix + ".eor");
      info->setDumpFileName(prefix + ".dump");
      info->setStatFileName(prefix + ".stat");
      info->setReportFileName(prefix + ".report");
      info->setRestFileName(prefix + ".zang");

#ifdef IS_MPI
    }
#endif
  }

#ifdef IS_MPI
  void SimCreator::divideMolecules(SimInfo* info) {
    RealType a;
    int nProcessors;
    std::vector<int> atomsPerProc;
    int nGlobalMols = info->getNGlobalMolecules();
    std::vector<int> molToProcMap(nGlobalMols, -1);  // default to an error
                                                     // condition:

    MPI_Comm_size(MPI_COMM_WORLD, &nProcessors);

    if (nProcessors > nGlobalMols) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "nProcessors (%d) > nMol (%d)\n"
               "\tThe number of processors is larger than\n"
               "\tthe number of molecules.  This will not result in a \n"
               "\tusable division of atoms for force decomposition.\n"
               "\tEither try a smaller number of processors, or run the\n"
               "\tsingle-processor version of OpenMD.\n",
               nProcessors, nGlobalMols);

      painCave.isFatal = 1;
      simError();
    }

    a = 3.0 * nGlobalMols / info->getNGlobalAtoms();

    // initialize atomsPerProc
    atomsPerProc.insert(atomsPerProc.end(), nProcessors, 0);

    if (worldRank == 0) {
      Utils::RandNumGenPtr myRandom = info->getRandomNumberGenerator();

      std::uniform_int_distribution<> processorDistribution {0,
                                                             nProcessors - 1};
      std::uniform_real_distribution<RealType> yDistribution {0, 1};

      RealType numerator   = info->getNGlobalAtoms();
      RealType denominator = nProcessors;
      RealType precast     = numerator / denominator;
      int nTarget          = (int)(precast + 0.5);
      int which_proc {0};

      for (int i = 0; i < nGlobalMols; i++) {
        // get the molecule stamp first
        int stampId                  = info->getMoleculeStampId(i);
        MoleculeStamp* moleculeStamp = info->getMoleculeStamp(stampId);
        int add_atoms                = moleculeStamp->getNAtoms();

        if (nProcessors > 1) {
          int done  = 0;
          int loops = 0;

          while (!done) {
            loops++;

            // Pick a processor at random
            which_proc = processorDistribution(*myRandom);

            // How many atoms does this processor have so far?
            int old_atoms = atomsPerProc[which_proc];
            int new_atoms = old_atoms + add_atoms;

            // If we've been through this loop too many times, we need
            // to just give up and assign the molecule to this processor
            // and be done with it.

            if (loops > 100) {
              snprintf(
                  painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                  "There have been 100 attempts to assign molecule %d to an\n"
                  "\tunderworked processor, but there's no good place to\n"
                  "\tleave it. OpenMD is assigning it at random to processor "
                  "%d.\n",
                  i, which_proc);

              painCave.isFatal  = 0;
              painCave.severity = OPENMD_INFO;
              simError();

              molToProcMap[i] = which_proc;
              atomsPerProc[which_proc] += add_atoms;

              done = 1;
              continue;
            }

            // If we can add this molecule to this processor without sending
            // it above nTarget, then go ahead and do it:

            if (new_atoms <= nTarget) {
              molToProcMap[i] = which_proc;
              atomsPerProc[which_proc] += add_atoms;

              done = 1;
              continue;
            }

            // The only situation left is when new_atoms > nTarget.  We
            // want to accept this with some probability that dies off the
            // farther we are from nTarget

            // roughly:  x = new_atoms - nTarget
            //           Pacc(x) = exp(- a * x)
            // where a = penalty / (average atoms per molecule)

            RealType x = (RealType)(new_atoms - nTarget);
            RealType y = yDistribution(*myRandom);

            if (y < exp(-a * x)) {
              molToProcMap[i] = which_proc;
              atomsPerProc[which_proc] += add_atoms;

              done = 1;
              continue;
            } else {
              continue;
            }
          }
        } else {
          which_proc      = 0;
          molToProcMap[i] = which_proc;
          atomsPerProc[which_proc] += add_atoms;
        }
      }

      // Spray out this nonsense to all other processors:
      MPI_Bcast(&molToProcMap[0], nGlobalMols, MPI_INT, 0, MPI_COMM_WORLD);

    } else {
      // Listen to your marching orders from processor 0:
      MPI_Bcast(&molToProcMap[0], nGlobalMols, MPI_INT, 0, MPI_COMM_WORLD);
    }

    info->setMolToProcMap(molToProcMap);
    snprintf(checkPointMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Successfully divided the molecules among the processors.\n");
    errorCheckPoint();
  }

#endif

  void SimCreator::createMolecules(SimInfo* info) {
    MoleculeCreator molCreator;
    int stampId;

    for (int i = 0; i < info->getNGlobalMolecules(); i++) {
      stampId       = info->getMoleculeStampId(i);
      molCreator.createOverrideAtomTypes(info->getForceField(),
					 info->getMoleculeStamp(stampId));

#ifdef IS_MPI
      if (info->getMolToProc(i) == worldRank) {
#endif

        Molecule* mol = molCreator.createMolecule(
            info->getForceField(), info->getMoleculeStamp(stampId), i,
            info->getLocalIndexManager());

        info->addMolecule(mol);

#ifdef IS_MPI
      }
#endif
    }
  }

  void SimCreator::computeStorageLayouts(SimInfo* info) {
    Globals* simParams    = info->getSimParams();
    int nRigidBodies      = info->getNGlobalRigidBodies();
    AtomTypeSet atomTypes = info->getSimulatedAtomTypes();
    AtomTypeSet::iterator i;
    bool hasDirectionalAtoms     = false;
    bool hasFixedCharge          = false;
    bool hasDipoles              = false;
    bool hasQuadrupoles          = false;
    bool hasPolarizable          = false;
    bool hasFluctuatingCharge    = false;
    bool hasMetallic             = false;
    int atomStorageLayout        = 0;
    int rigidBodyStorageLayout   = 0;
    int cutoffGroupStorageLayout = 0;

    atomStorageLayout |= DataStorage::dslPosition;
    atomStorageLayout |= DataStorage::dslVelocity;
    atomStorageLayout |= DataStorage::dslForce;
    cutoffGroupStorageLayout |= DataStorage::dslPosition;

    for (i = atomTypes.begin(); i != atomTypes.end(); ++i) {
      DirectionalAdapter da        = DirectionalAdapter((*i));
      MultipoleAdapter ma          = MultipoleAdapter((*i));
      EAMAdapter ea                = EAMAdapter((*i));
      SuttonChenAdapter sca        = SuttonChenAdapter((*i));
      PolarizableAdapter pa        = PolarizableAdapter((*i));
      FixedChargeAdapter fca       = FixedChargeAdapter((*i));
      FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter((*i));

      if (da.isDirectional()) { hasDirectionalAtoms = true; }
      if (ma.isDipole()) { hasDipoles = true; }
      if (ma.isQuadrupole()) { hasQuadrupoles = true; }
      if (ea.isEAM() || sca.isSuttonChen()) { hasMetallic = true; }
      if (fca.isFixedCharge()) { hasFixedCharge = true; }
      if (fqa.isFluctuatingCharge()) { hasFluctuatingCharge = true; }
      if (pa.isPolarizable()) { hasPolarizable = true; }
    }

    if (nRigidBodies > 0) {
      rigidBodyStorageLayout |= DataStorage::dslPosition;
      rigidBodyStorageLayout |= DataStorage::dslVelocity;
      rigidBodyStorageLayout |= DataStorage::dslForce;
      rigidBodyStorageLayout |= DataStorage::dslAmat;
      rigidBodyStorageLayout |= DataStorage::dslAngularMomentum;
      rigidBodyStorageLayout |= DataStorage::dslTorque;
    }
    if (hasDirectionalAtoms) {
      atomStorageLayout |= DataStorage::dslAmat;
      if (atomStorageLayout & DataStorage::dslVelocity) {
        atomStorageLayout |= DataStorage::dslAngularMomentum;
      }
      if (atomStorageLayout & DataStorage::dslForce) {
        atomStorageLayout |= DataStorage::dslTorque;
      }
    }
    if (hasDipoles) { atomStorageLayout |= DataStorage::dslDipole; }
    if (hasQuadrupoles) { atomStorageLayout |= DataStorage::dslQuadrupole; }
    if (hasFixedCharge || hasFluctuatingCharge) {
      atomStorageLayout |= DataStorage::dslSkippedCharge;
    }
    if (hasMetallic) {
      atomStorageLayout |= DataStorage::dslDensity;
      atomStorageLayout |= DataStorage::dslFunctional;
      atomStorageLayout |= DataStorage::dslFunctionalDerivative;
    }
    if (hasPolarizable) { atomStorageLayout |= DataStorage::dslElectricField; }
    if (hasFluctuatingCharge) {
      atomStorageLayout |= DataStorage::dslFlucQPosition;
      if (atomStorageLayout & DataStorage::dslVelocity) {
        atomStorageLayout |= DataStorage::dslFlucQVelocity;
      }
      if (atomStorageLayout & DataStorage::dslForce) {
        atomStorageLayout |= DataStorage::dslFlucQForce;
      }
    }

    // if the user has asked for them, make sure we've got the memory for the
    // objects defined.

    if (simParams->getOutputParticlePotential()) {
      atomStorageLayout |= DataStorage::dslParticlePot;
    }

    if (simParams->havePrintHeatFlux()) {
      if (simParams->getPrintHeatFlux()) {
        atomStorageLayout |= DataStorage::dslParticlePot;
      }
    }

    if (simParams->getOutputElectricField() | simParams->haveElectricField() |
        simParams->haveUniformField() |
        simParams->haveUniformGradientStrength() |
        simParams->haveUniformGradientDirection1() |
        simParams->haveUniformGradientDirection2() |
        simParams->getLightParameters()->getUseLight()) {
      atomStorageLayout |= DataStorage::dslElectricField;
      rigidBodyStorageLayout |= DataStorage::dslElectricField;
    }

    if (simParams->getRNEMDParameters()->haveUseRNEMD()) {
      if (simParams->getRNEMDParameters()->getUseRNEMD()) {
        if (simParams->getRNEMDParameters()->requiresElectricField()) {
          atomStorageLayout |= DataStorage::dslElectricField;
          rigidBodyStorageLayout |= DataStorage::dslElectricField;
        }
      }
    }

    if (simParams->getOutputSitePotential()) {
      atomStorageLayout |= DataStorage::dslSitePotential;
      rigidBodyStorageLayout |= DataStorage::dslSitePotential;
    }

    if (simParams->getOutputFluctuatingCharges()) {
      atomStorageLayout |= DataStorage::dslFlucQPosition;
      atomStorageLayout |= DataStorage::dslFlucQVelocity;
      atomStorageLayout |= DataStorage::dslFlucQForce;
    }

    info->setAtomStorageLayout(atomStorageLayout);
    info->setRigidBodyStorageLayout(rigidBodyStorageLayout);
    info->setCutoffGroupStorageLayout(cutoffGroupStorageLayout);

    return;
  }

  void SimCreator::setGlobalIndex(SimInfo* info) {
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator ri;
    Molecule::CutoffGroupIterator ci;
    Molecule::BondIterator boi;
    Molecule::BendIterator bei;
    Molecule::TorsionIterator ti;
    Molecule::InversionIterator ii;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    CutoffGroup* cg;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;
    int beginAtomIndex;
    int beginRigidBodyIndex;
    int beginCutoffGroupIndex;
    int beginBondIndex;
    int beginBendIndex;
    int beginTorsionIndex;
    int beginInversionIndex;
#ifdef IS_MPI
    int nGlobalAtoms       = info->getNGlobalAtoms();
    int nGlobalRigidBodies = info->getNGlobalRigidBodies();
#endif

    beginAtomIndex = 0;
    // The rigid body indices begin immediately after the atom indices:
    beginRigidBodyIndex   = info->getNGlobalAtoms();
    beginCutoffGroupIndex = 0;
    beginBondIndex        = 0;
    beginBendIndex        = 0;
    beginTorsionIndex     = 0;
    beginInversionIndex   = 0;

    for (int i = 0; i < info->getNGlobalMolecules(); i++) {
#ifdef IS_MPI
      if (info->getMolToProc(i) == worldRank) {
#endif
        // stuff to do if I own this molecule
        mol = info->getMoleculeByGlobalIndex(i);

        // The local index(index in DataStorge) of the atom is important:
        for (atom = mol->beginAtom(ai); atom != NULL;
             atom = mol->nextAtom(ai)) {
          atom->setGlobalIndex(beginAtomIndex++);
        }

        for (rb = mol->beginRigidBody(ri); rb != NULL;
             rb = mol->nextRigidBody(ri)) {
          rb->setGlobalIndex(beginRigidBodyIndex++);
        }

        // The local index of other objects only depends on the order
        // of traversal:
        for (cg = mol->beginCutoffGroup(ci); cg != NULL;
             cg = mol->nextCutoffGroup(ci)) {
          cg->setGlobalIndex(beginCutoffGroupIndex++);
        }
        for (bond = mol->beginBond(boi); bond != NULL;
             bond = mol->nextBond(boi)) {
          bond->setGlobalIndex(beginBondIndex++);
        }
        for (bend = mol->beginBend(bei); bend != NULL;
             bend = mol->nextBend(bei)) {
          bend->setGlobalIndex(beginBendIndex++);
        }
        for (torsion = mol->beginTorsion(ti); torsion != NULL;
             torsion = mol->nextTorsion(ti)) {
          torsion->setGlobalIndex(beginTorsionIndex++);
        }
        for (inversion = mol->beginInversion(ii); inversion != NULL;
             inversion = mol->nextInversion(ii)) {
          inversion->setGlobalIndex(beginInversionIndex++);
        }

#ifdef IS_MPI
      } else {
        // stuff to do if I don't own this molecule

        int stampId          = info->getMoleculeStampId(i);
        MoleculeStamp* stamp = info->getMoleculeStamp(stampId);

        beginAtomIndex += stamp->getNAtoms();
        beginRigidBodyIndex += stamp->getNRigidBodies();
        beginCutoffGroupIndex +=
            stamp->getNCutoffGroups() + stamp->getNFreeAtoms();
        beginBondIndex += stamp->getNBonds();
        beginBendIndex += stamp->getNBends();
        beginTorsionIndex += stamp->getNTorsions();
        beginInversionIndex += stamp->getNInversions();
      }
#endif

    }  // end for(int i=0)

    // fill globalGroupMembership
    std::vector<int> globalGroupMembership(info->getNGlobalAtoms(), 0);
    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      for (cg = mol->beginCutoffGroup(ci); cg != NULL;
           cg = mol->nextCutoffGroup(ci)) {
        for (atom = cg->beginAtom(ai); atom != NULL; atom = cg->nextAtom(ai)) {
          globalGroupMembership[atom->getGlobalIndex()] = cg->getGlobalIndex();
        }
      }
    }

#ifdef IS_MPI
    // Since the globalGroupMembership has been zero filled and we've only
    // poked values into the atoms we know, we can do an Allreduce
    // to get the full globalGroupMembership array (We think).
    // This would be prettier if we could use MPI_IN_PLACE like the MPI-2
    // docs said we could.
    std::vector<int> tmpGroupMembership(info->getNGlobalAtoms(), 0);
    MPI_Allreduce(&globalGroupMembership[0], &tmpGroupMembership[0],
                  nGlobalAtoms, MPI_INT, MPI_SUM, MPI_COMM_WORLD);

    info->setGlobalGroupMembership(tmpGroupMembership);
#else
    info->setGlobalGroupMembership(globalGroupMembership);
#endif

    // fill molMembership
    std::vector<int> globalMolMembership(
        info->getNGlobalAtoms() + info->getNGlobalRigidBodies(), 0);

    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        globalMolMembership[atom->getGlobalIndex()] = mol->getGlobalIndex();
      }
      for (rb = mol->beginRigidBody(ri); rb != NULL;
           rb = mol->nextRigidBody(ri)) {
        globalMolMembership[rb->getGlobalIndex()] = mol->getGlobalIndex();
      }
    }

#ifdef IS_MPI
    std::vector<int> tmpMolMembership(
        info->getNGlobalAtoms() + info->getNGlobalRigidBodies(), 0);
    MPI_Allreduce(&globalMolMembership[0], &tmpMolMembership[0],
                  nGlobalAtoms + nGlobalRigidBodies, MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);

    info->setGlobalMolMembership(tmpMolMembership);
#else
    info->setGlobalMolMembership(globalMolMembership);
#endif

    // nIOPerMol holds the number of integrable objects per molecule
    // here the molecules are listed by their global indices.

    std::vector<int> nIOPerMol(info->getNGlobalMolecules(), 0);
    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      nIOPerMol[mol->getGlobalIndex()] = mol->getNIntegrableObjects();
    }

#ifdef IS_MPI
    std::vector<int> numIntegrableObjectsPerMol(info->getNGlobalMolecules(), 0);
    MPI_Allreduce(&nIOPerMol[0], &numIntegrableObjectsPerMol[0],
                  info->getNGlobalMolecules(), MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);
#else
    std::vector<int> numIntegrableObjectsPerMol = nIOPerMol;
#endif

    std::vector<int> startingIOIndexForMol(info->getNGlobalMolecules());

    int startingIndex = 0;
    for (int i = 0; i < info->getNGlobalMolecules(); i++) {
      startingIOIndexForMol[i] = startingIndex;
      startingIndex += numIntegrableObjectsPerMol[i];
    }

    std::vector<StuntDouble*> IOIndexToIntegrableObject(
        info->getNGlobalIntegrableObjects(), (StuntDouble*)NULL);
    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      int myGlobalIndex = mol->getGlobalIndex();
      int globalIO      = startingIOIndexForMol[myGlobalIndex];
      for (StuntDouble* sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd              = mol->nextIntegrableObject(ioi)) {
        sd->setGlobalIntegrableObjectIndex(globalIO);
        IOIndexToIntegrableObject[globalIO] = sd;
        globalIO++;
      }
    }

    info->setIOIndexToIntegrableObject(IOIndexToIntegrableObject);
  }

  void SimCreator::loadCoordinates(SimInfo* info,
                                   const std::string& mdFileName) {
    DumpReader reader(info, mdFileName);
    int nframes = reader.getNFrames();

    if (nframes > 0) {
      reader.readFrame(nframes - 1);
    } else {
      // invalid initial coordinate file
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "Initial configuration file %s should at least contain one frame\n",
          mdFileName.c_str());
      painCave.isFatal = 1;
      simError();
    }
    // copy the current snapshot to previous snapshot
    info->getSnapshotManager()->advance();
  }

}